

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.h
# Opt level: O0

void __thiscall
Order::Order(Order *this,string *clientId,string *symbol,string *owner,string *target,Side side,
            Type type,double price,long quantity)

{
  double price_local;
  Side side_local;
  string *target_local;
  string *owner_local;
  string *symbol_local;
  string *clientId_local;
  Order *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)clientId);
  std::__cxx11::string::string((string *)&this->m_symbol,(string *)symbol);
  std::__cxx11::string::string((string *)&this->m_owner,(string *)owner);
  std::__cxx11::string::string((string *)&this->m_target,(string *)target);
  this->m_side = side;
  this->m_type = type;
  this->m_price = price;
  this->m_quantity = quantity;
  this->m_openQuantity = this->m_quantity;
  this->m_executedQuantity = 0;
  this->m_avgExecutedPrice = 0.0;
  this->m_lastExecutedPrice = 0.0;
  this->m_lastExecutedQuantity = 0;
  return;
}

Assistant:

Order( const std::string& clientId, const std::string& symbol,
         const std::string& owner, const std::string& target,
         Side side, Type type, double price, long quantity )
: m_clientId( clientId ), m_symbol( symbol ), m_owner( owner ),
  m_target( target ), m_side( side ), m_type( type ), m_price( price ),
  m_quantity( quantity )
  {
    m_openQuantity = m_quantity;
    m_executedQuantity = 0;
    m_avgExecutedPrice = 0;
    m_lastExecutedPrice = 0;
    m_lastExecutedQuantity = 0;
  }